

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.cpp
# Opt level: O1

int __thiscall JsonTest::Runner::runCommandLine(Runner *this,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  _Elt_pointer pp_Var5;
  int iVar6;
  ulong uVar7;
  _Deque_base<JsonTest::TestCase_*(*)(),_std::allocator<JsonTest::TestCase_*(*)()>_> *p_Var8;
  uint unaff_R13D;
  uint testNameIndex;
  string opt;
  Runner subrunner;
  allocator local_f1;
  char **local_f0;
  int local_e4;
  _Deque_base<JsonTest::TestCase_*(*)(),_std::allocator<JsonTest::TestCase_*(*)()>_> *local_e0;
  uint local_d4;
  long local_d0;
  undefined1 local_c8 [32];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  _Deque_base<JsonTest::TestCase_*(*)(),_std::allocator<JsonTest::TestCase_*(*)()>_> local_88;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_f0 = argv;
  std::_Deque_base<JsonTest::TestCase_*(*)(),_std::allocator<JsonTest::TestCase_*(*)()>_>::
  _M_initialize_map(&local_88,0);
  bVar2 = 1 < argc;
  local_e4 = argc;
  if (1 < argc) {
    iVar6 = 1;
    local_e0 = (_Deque_base<JsonTest::TestCase_*(*)(),_std::allocator<JsonTest::TestCase_*(*)()>_> *
               )this;
    do {
      p_Var8 = local_e0;
      std::__cxx11::string::string((string *)local_a8,local_f0[iVar6],(allocator *)local_c8);
      iVar3 = std::__cxx11::string::compare((char *)local_a8);
      if (iVar3 == 0) {
        unaff_R13D = 0;
        listTests((Runner *)p_Var8);
        bVar1 = false;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)local_a8);
        if (iVar3 == 0) {
          bVar1 = true;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)local_a8);
          if ((iVar3 == 0) && (iVar6 = iVar6 + 1, iVar6 < local_e4)) {
            local_d0 = (long)iVar6;
            std::__cxx11::string::string((string *)local_c8,local_f0[local_d0],&local_f1);
            bVar1 = testIndex((Runner *)p_Var8,(string *)local_c8,&local_d4);
            if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
              operator_delete((void *)local_c8._0_8_);
            }
            if (bVar1) {
              pp_Var5 = (local_e0->_M_impl).super__Deque_impl_data._M_start._M_cur;
              uVar4 = ((long)pp_Var5 -
                       (long)(local_e0->_M_impl).super__Deque_impl_data._M_start._M_first >> 3) +
                      (ulong)local_d4;
              if (uVar4 < 0x40) {
                pp_Var5 = pp_Var5 + local_d4;
              }
              else {
                uVar7 = (uVar4 >> 6) + 0xfc00000000000000;
                if (0 < (long)uVar4) {
                  uVar7 = uVar4 >> 6;
                }
                pp_Var5 = (local_e0->_M_impl).super__Deque_impl_data._M_start._M_node[uVar7] +
                          uVar4 + uVar7 * -0x40;
              }
              local_c8._0_8_ = *pp_Var5;
              if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<JsonTest::TestCase*(*)(),std::allocator<JsonTest::TestCase*(*)()>>::
                _M_push_back_aux<JsonTest::TestCase*(*const&)()>
                          ((deque<JsonTest::TestCase*(*)(),std::allocator<JsonTest::TestCase*(*)()>>
                            *)&local_88,(_func_TestCase_ptr **)local_c8);
              }
              else {
                *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     (_func_TestCase_ptr *)local_c8._0_8_;
                local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
              }
              goto LAB_0011c60a;
            }
            runCommandLine();
          }
          else {
            bVar1 = false;
            printf("Usage: %s [options]\n\nIf --test is not specified, then all the test cases be run.\n\nValid options:\n--list-tests: print the name of all test cases on the standard\n              output and exit.\n--test TESTNAME: executes the test case with the specified name.\n                 May be repeated.\n--test-auto: prevent dialog prompting for debugging on crash.\n"
                   ,*local_f0);
          }
          unaff_R13D = 2;
        }
      }
LAB_0011c60a:
      if (local_a8[0] != local_98) {
        operator_delete(local_a8[0]);
      }
      this = (Runner *)local_e0;
      if (bVar1 == false) break;
      iVar6 = iVar6 + 1;
      bVar2 = iVar6 < local_e4;
    } while (iVar6 < local_e4);
  }
  if (!bVar2) {
    iVar6 = (int)((ulong)((long)local_88._M_impl.super__Deque_impl_data._M_start._M_last -
                         (long)local_88._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) +
            (int)((ulong)((long)local_88._M_impl.super__Deque_impl_data._M_finish._M_cur -
                         (long)local_88._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) +
            ((((uint)((int)local_88._M_impl.super__Deque_impl_data._M_finish._M_node -
                     (int)local_88._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
            (uint)(local_88._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0))
            * 0x40;
    p_Var8 = &local_88;
    if (iVar6 == 0) {
      p_Var8 = (_Deque_base<JsonTest::TestCase_*(*)(),_std::allocator<JsonTest::TestCase_*(*)()>_> *
               )this;
    }
    bVar2 = runAllTest((Runner *)p_Var8,iVar6 != 1);
    unaff_R13D = (uint)!bVar2;
  }
  std::_Deque_base<JsonTest::TestCase_*(*)(),_std::allocator<JsonTest::TestCase_*(*)()>_>::
  ~_Deque_base(&local_88);
  return unaff_R13D;
}

Assistant:

int Runner::runCommandLine(int argc, const char* argv[]) const {
  // typedef std::deque<std::string> TestNames;
  Runner subrunner;
  for (int index = 1; index < argc; ++index) {
    std::string opt = argv[index];
    if (opt == "--list-tests") {
      listTests();
      return 0;
    } else if (opt == "--test-auto") {
      preventDialogOnCrash();
    } else if (opt == "--test") {
      ++index;
      if (index < argc) {
        unsigned int testNameIndex;
        if (testIndex(argv[index], testNameIndex)) {
          subrunner.add(tests_[testNameIndex]);
        } else {
          fprintf(stderr, "Test '%s' does not exist!\n", argv[index]);
          return 2;
        }
      } else {
        printUsage(argv[0]);
        return 2;
      }
    } else {
      printUsage(argv[0]);
      return 2;
    }
  }
  bool succeeded;
  if (subrunner.testCount() > 0) {
    succeeded = subrunner.runAllTest(subrunner.testCount() > 1);
  } else {
    succeeded = runAllTest(true);
  }
  return succeeded ? 0 : 1;
}